

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O1

void __thiscall QCborArray::insert(QCborArray *this,qsizetype i,QCborValue *value)

{
  QCborContainerPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if (i < 0) {
    if (pQVar1 == (QCborContainerPrivate *)0x0) {
      i = 0;
    }
    else {
      i = (pQVar1->elements).d.size;
    }
    detach(this,i + 1);
  }
  else {
    pQVar1 = QCborContainerPrivate::grow(pQVar1,i);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->d,pQVar1);
  }
  QCborContainerPrivate::insertAt((this->d).d.ptr,i,value,CopyContainer);
  return;
}

Assistant:

void QCborArray::insert(qsizetype i, const QCborValue &value)
{
    if (i < 0) {
        Q_ASSERT(i == -1);
        i = size();
        detach(i + 1);
    } else {
        d = QCborContainerPrivate::grow(d.data(), i); // detaches
    }
    d->insertAt(i, value);
}